

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O1

void __thiscall MDPValueIteration::SetQTable(MDPValueIteration *this,QTable *Q,Index time_step)

{
  QTable *pQVar1;
  pointer pQVar2;
  size_type __n;
  pointer pdVar3;
  size_type sVar4;
  size_type sVar5;
  double *pdVar6;
  
  pQVar2 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar1 = pQVar2 + time_step;
  sVar5 = (Q->super_matrix_t).size2_;
  pQVar2[time_step].super_matrix_t.size1_ = (Q->super_matrix_t).size1_;
  pQVar2[time_step].super_matrix_t.size2_ = sVar5;
  if (pQVar1 != Q) {
    __n = (Q->super_matrix_t).data_.size_;
    if ((pQVar1->super_matrix_t).data_.size_ != __n) {
      pdVar3 = (pQVar1->super_matrix_t).data_.data_;
      if (__n != 0) {
        pdVar6 = __gnu_cxx::new_allocator<double>::allocate
                           ((new_allocator<double> *)&pQVar2[time_step].super_matrix_t.data_,__n,
                            (void *)0x0);
        (pQVar1->super_matrix_t).data_.data_ = pdVar6;
      }
      sVar4 = (pQVar1->super_matrix_t).data_.size_;
      if (sVar4 != 0) {
        operator_delete(pdVar3,sVar4 << 3);
      }
      if (__n == 0) {
        (pQVar1->super_matrix_t).data_.data_ = (pointer)0x0;
      }
      (pQVar1->super_matrix_t).data_.size_ = __n;
    }
    sVar4 = (Q->super_matrix_t).data_.size_;
    if (sVar4 != 0) {
      memmove((pQVar1->super_matrix_t).data_.data_,(Q->super_matrix_t).data_.data_,sVar4 << 3);
      return;
    }
  }
  return;
}

Assistant:

void MDPValueIteration::SetQTable(const QTable &Q, Index time_step)
{
    _m_QValues[time_step]=Q;
}